

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

Builder * __thiscall
capnp::_::PointerBuilder::initBlob<capnp::Text>
          (Builder *__return_storage_ptr__,PointerBuilder *this,ByteCount size)

{
  WirePointer *ref;
  SegmentBuilder *segment;
  CapTableBuilder *capTable;
  BuilderArena *this_00;
  uint uVar1;
  WirePointer *pWVar2;
  WirePointer *pWVar3;
  uint uVar4;
  AllocateResult AVar5;
  ThrowOverflow local_32;
  anon_class_1_0_00000001 local_31;
  
  ref = this->pointer;
  segment = this->segment;
  capTable = this->capTable;
  uVar1 = assertMax<536870910u,unsigned_int,kj::ThrowOverflow>(size,&local_32);
  uVar4 = uVar1 + 8 >> 3;
  if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
    WireHelpers::zeroObject(segment,capTable,ref);
  }
  pWVar3 = (WirePointer *)segment->pos;
  if (((long)((long)(segment->super_SegmentReader).ptr.ptr +
             ((segment->super_SegmentReader).ptr.size_ * 8 - (long)pWVar3)) >> 3 <
       (long)(ulong)uVar4) ||
     (segment->pos = (word *)(pWVar3 + uVar4), pWVar3 == (WirePointer *)0x0)) {
    this_00 = (BuilderArena *)(segment->super_SegmentReader).arena;
    uVar4 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                      (uVar4 + 1,&local_31);
    AVar5 = BuilderArena::allocate(this_00,uVar4);
    pWVar2 = (WirePointer *)AVar5.words;
    (ref->offsetAndKind).value =
         (int)AVar5.words - *(int *)&((AVar5.segment)->super_SegmentReader).ptr.ptr & 0xfffffff8U |
         2;
    ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                   ((AVar5.segment)->super_SegmentReader).id.value;
    (pWVar2->offsetAndKind).value = 1;
    pWVar3 = pWVar2 + 1;
  }
  else {
    (ref->offsetAndKind).value = ((uint)((ulong)((long)pWVar3 - (long)ref) >> 1) & 0xfffffffc) - 3;
    pWVar2 = ref;
  }
  (pWVar2->field_1).upper32Bits = uVar1 * 8 + 10;
  (__return_storage_ptr__->content).ptr = (char *)pWVar3;
  (__return_storage_ptr__->content).size_ = (ulong)uVar1 + 1;
  return __return_storage_ptr__;
}

Assistant:

Text::Builder PointerBuilder::initBlob<Text>(ByteCount size) {
  return WireHelpers::initTextPointer(pointer, segment, capTable,
      assertMax<MAX_TEXT_SIZE>(size, ThrowOverflow())).value;
}